

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktWsiSwapchainTests.cpp
# Opt level: O2

TestStatus *
vkt::wsi::anon_unknown_0::destroyNullHandleSwapchainTest
          (TestStatus *__return_storage_ptr__,Context *context,Type wsiType)

{
  VkAllocationCallbacks *allocator;
  allocator<char> local_789;
  RefBase<vk::Handle<(vk::HandleType)25>_> local_788;
  string local_760;
  NativeObjects native;
  AllocationCallbackRecorder recordingAllocator;
  InstanceHelper instHelper;
  DeviceHelper devHelper;
  
  InstanceHelper::InstanceHelper(&instHelper,context,wsiType,(VkAllocationCallbacks *)0x0);
  devHelper.physicalDevice = (VkPhysicalDevice)0x0;
  NativeObjects::NativeObjects
            (&native,context,&instHelper.supportedExtensions,wsiType,
             (Maybe<tcu::Vector<unsigned_int,_2>_> *)&devHelper);
  ::vk::wsi::createSurface
            ((Move<vk::Handle<(vk::HandleType)25>_> *)&devHelper,
             &instHelper.vki.super_InstanceInterface,
             instHelper.instance.super_RefBase<vk::VkInstance_s_*>.m_data.object,wsiType,
             native.display.
             super_UniqueBase<vk::wsi::Display,_de::DefaultDeleter<vk::wsi::Display>_>.m_data.ptr,
             native.window.super_UniqueBase<vk::wsi::Window,_de::DefaultDeleter<vk::wsi::Window>_>.
             m_data.ptr,(VkAllocationCallbacks *)0x0);
  local_788.m_data.deleter.m_instance =
       (VkInstance)devHelper.device.super_RefBase<vk::VkDevice_s_*>.m_data.object;
  local_788.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)
       devHelper.device.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_destroyDevice;
  local_788.m_data.object.m_internal = (deUint64)devHelper.physicalDevice;
  local_788.m_data.deleter.m_instanceIface = (InstanceInterface *)devHelper._8_8_;
  devHelper.physicalDevice = (VkPhysicalDevice)0x0;
  devHelper.queueFamilyIndex = 0;
  devHelper._12_4_ = 0;
  devHelper.device.super_RefBase<vk::VkDevice_s_*>.m_data.object = (VkDevice_s *)0x0;
  devHelper.device.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_destroyDevice =
       (DestroyDeviceFunc)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)25>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)25>_> *)&devHelper);
  DeviceHelper::DeviceHelper
            (&devHelper,context,&instHelper.vki.super_InstanceInterface,
             instHelper.instance.super_RefBase<vk::VkInstance_s_*>.m_data.object,
             (VkSurfaceKHR)local_788.m_data.object.m_internal,(VkAllocationCallbacks *)0x0);
  ::vk::DeviceDriver::destroySwapchainKHR
            (&devHelper.vkd,devHelper.device.super_RefBase<vk::VkDevice_s_*>.m_data.object,
             (VkSwapchainKHR)0x0,(VkAllocationCallbacks *)0x0);
  allocator = ::vk::getSystemAllocator();
  ::vk::AllocationCallbackRecorder::AllocationCallbackRecorder(&recordingAllocator,allocator,1);
  ::vk::DeviceDriver::destroySwapchainKHR
            (&devHelper.vkd,devHelper.device.super_RefBase<vk::VkDevice_s_*>.m_data.object,
             (VkSwapchainKHR)0x0,
             &recordingAllocator.super_ChainedAllocator.super_AllocationCallbacks.m_callbacks);
  if (recordingAllocator.m_records.m_numElements == 0) {
    ::vk::AllocationCallbackRecorder::~AllocationCallbackRecorder(&recordingAllocator);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&recordingAllocator,"Destroying a VK_NULL_HANDLE surface has no effect",
               (allocator<char> *)&local_760);
    tcu::TestStatus::pass(__return_storage_ptr__,(string *)&recordingAllocator);
    std::__cxx11::string::~string((string *)&recordingAllocator);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_760,"Implementation allocated/freed the memory",&local_789);
    tcu::TestStatus::fail(__return_storage_ptr__,&local_760);
    std::__cxx11::string::~string((string *)&local_760);
    ::vk::AllocationCallbackRecorder::~AllocationCallbackRecorder(&recordingAllocator);
  }
  DeviceHelper::~DeviceHelper(&devHelper);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)25>_>::~RefBase(&local_788);
  NativeObjects::~NativeObjects(&native);
  InstanceHelper::~InstanceHelper(&instHelper);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus destroyNullHandleSwapchainTest (Context& context, Type wsiType)
{
	const InstanceHelper		instHelper	(context, wsiType);
	const NativeObjects			native		(context, instHelper.supportedExtensions, wsiType);
	const Unique<VkSurfaceKHR>	surface		(createSurface(instHelper.vki, *instHelper.instance, wsiType, *native.display, *native.window));
	const DeviceHelper			devHelper	(context, instHelper.vki, *instHelper.instance, *surface);
	const VkSwapchainKHR		nullHandle	= DE_NULL;

	// Default allocator
	devHelper.vkd.destroySwapchainKHR(*devHelper.device, nullHandle, DE_NULL);

	// Custom allocator
	{
		AllocationCallbackRecorder	recordingAllocator	(getSystemAllocator(), 1u);

		devHelper.vkd.destroySwapchainKHR(*devHelper.device, nullHandle, recordingAllocator.getCallbacks());

		if (recordingAllocator.getNumRecords() != 0u)
			return tcu::TestStatus::fail("Implementation allocated/freed the memory");
	}

	return tcu::TestStatus::pass("Destroying a VK_NULL_HANDLE surface has no effect");
}